

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.h
# Opt level: O0

void __thiscall lzham::lzcompressor::init_params::init_params(init_params *this)

{
  init_params *this_local;
  
  this->m_pTask_pool = (task_pool *)0x0;
  this->m_max_helper_threads = 0;
  this->m_compression_level = cCompressionLevelDefault;
  this->m_dict_size_log2 = 0x16;
  this->m_block_size = 0x80000;
  this->m_num_cachelines = 0;
  this->m_cacheline_size = 0;
  this->m_lzham_compress_flags = 0;
  return;
}

Assistant:

init_params() :
            m_pTask_pool(NULL),
            m_max_helper_threads(0),
            m_compression_level(cCompressionLevelDefault),
            m_dict_size_log2(22),
            m_block_size(cDefaultBlockSize),
            m_num_cachelines(0),
            m_cacheline_size(0),
            m_lzham_compress_flags(0)
         {
         }